

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controls.c
# Opt level: O3

void FormatKey(char *buffer,char key)

{
  __int32_t **pp_Var1;
  undefined3 in_register_00000031;
  int iVar2;
  
  iVar2 = CONCAT31(in_register_00000031,key);
  if (iVar2 < 0x1b) {
    if (iVar2 == 8) {
      builtin_strncpy(buffer,"bkspc",6);
      return;
    }
    if (iVar2 == 9) {
      builtin_strncpy(buffer,"tab",4);
      return;
    }
    if (iVar2 == 10) {
      builtin_strncpy(buffer,"enter",6);
      return;
    }
  }
  else {
    if (iVar2 == 0x1b) {
      builtin_strncpy(buffer,"esc",4);
      return;
    }
    if (iVar2 == 0x7f) {
      builtin_strncpy(buffer,"del",4);
      return;
    }
    if (iVar2 == 0x20) {
      builtin_strncpy(buffer,"space",6);
      return;
    }
  }
  pp_Var1 = __ctype_toupper_loc();
  *buffer = (char)(*pp_Var1)[key];
  buffer[1] = '\0';
  return;
}

Assistant:

static void FormatKey(char* buffer, char key)
{
  switch (key) {
    case ' ': sprintf(buffer, "space"); break;
    case '\n': sprintf(buffer, "enter"); break;
    case '\b': sprintf(buffer, "bkspc"); break;
    case '\t': sprintf(buffer, "tab"); break;
    case '\x1B': sprintf(buffer, "esc"); break;
    case '\x7f': sprintf(buffer, "del"); break;
    default: sprintf(buffer, "%c", toupper(key)); break;
  }
}